

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O2

void __thiscall pfederc::Parser::sanityExpect(Parser *this,TokenType type)

{
  bool bVar1;
  allocator<char> local_29;
  string local_28;
  
  bVar1 = Token::operator!=(this->lexer->currentToken,type);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Unexpected token",&local_29);
    fatal("syntax_error.cpp",6,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    return;
  }
  Lexer::next(this->lexer);
  return;
}

Assistant:

void Parser::sanityExpect(TokenType type) noexcept {
  if (*lexer.getCurrentToken() != type) {
    fatal("syntax_error.cpp", __LINE__, "Unexpected token");
    return;
  }

  lexer.next();
}